

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

Violation mp::
          ComputeViolation<std::array<int,1ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::NotId,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::NotId>
                     *c,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  double dVar1;
  int i;
  CtxVal CVar2;
  pointer pdVar3;
  double dVar4;
  double dVar5;
  Violation VVar6;
  
  i = (c->super_FunctionalConstraint).result_var_;
  pdVar3 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar5 = pdVar3[i];
  if (x->recomp_vals_ == false) {
    dVar4 = dVar5 - (double)(-(ulong)(pdVar3[(c->
                                             super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId>
                                             ).args_._M_elems[0]] < 0.5) & 0x3ff0000000000000);
    CVar2 = (c->super_FunctionalConstraint).ctx.value_;
    if (CVar2 != CTX_POS) {
      if (CVar2 == CTX_NEG) {
        dVar4 = -dVar4;
      }
      else if (CVar2 == CTX_MIX) {
        dVar4 = ABS(dVar4);
      }
      else {
        dVar5 = 0.0;
        dVar4 = INFINITY;
      }
    }
  }
  else {
    dVar1 = (x->x_raw_).data_[i];
    dVar4 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::bounds_viol(x,i);
    if (dVar4 <= 0.0) {
      dVar4 = 0.0;
    }
    dVar4 = dVar4 + ABS(dVar5 - dVar1);
    dVar5 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[i];
  }
  VVar6.valX_ = dVar5;
  VVar6.viol_ = dVar4;
  return VVar6;
}

Assistant:

int GetResultVar() const { return result_var_; }